

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

NodePtr avro::resolveSymbol(NodePtr *node)

{
  Type TVar1;
  type this;
  undefined8 uVar2;
  shared_count extraout_RDX;
  shared_ptr<avro::Node> *in_RSI;
  element_type *in_RDI;
  NodePtr NVar3;
  shared_ptr<avro::NodeSymbolic> symNode;
  NodeSymbolic *in_stack_00000098;
  string *in_stack_ffffffffffffff78;
  Exception *in_stack_ffffffffffffff80;
  shared_ptr<avro::NodeSymbolic> *this_00;
  shared_ptr<avro::Node> *in_stack_ffffffffffffff88;
  shared_count in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  this = boost::shared_ptr<avro::Node>::operator->(in_RSI);
  TVar1 = Node::type(this);
  if (TVar1 != AVRO_NUM_TYPES) {
    uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
    uVar2 = __cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,(char *)CONCAT44(in_stack_ffffffffffffffbc,uVar4),
               (allocator<char> *)in_stack_ffffffffffffffb0.pi_);
    Exception::Exception(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  this_00 = (shared_ptr<avro::NodeSymbolic> *)&stack0xffffffffffffffa8;
  boost::static_pointer_cast<avro::NodeSymbolic,avro::Node>(in_stack_ffffffffffffff88);
  boost::shared_ptr<avro::NodeSymbolic>::operator->(this_00);
  NodeSymbolic::getNode(in_stack_00000098);
  boost::shared_ptr<avro::NodeSymbolic>::~shared_ptr((shared_ptr<avro::NodeSymbolic> *)0x26ae48);
  NVar3.pn.pi_ = extraout_RDX.pi_;
  NVar3.px = in_RDI;
  return NVar3;
}

Assistant:

inline NodePtr resolveSymbol(const NodePtr &node) 
{
    if(node->type() != AVRO_SYMBOLIC) {
        throw Exception("Only symbolic nodes may be resolved");
    }
    boost::shared_ptr<NodeSymbolic> symNode = boost::static_pointer_cast<NodeSymbolic>(node);
    return symNode->getNode();
}